

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Blip_Buffer.cpp
# Opt level: O3

blargg_err_t __thiscall Blip_Buffer::set_sample_rate(Blip_Buffer *this,long new_rate,int msec)

{
  long lVar1;
  buf_t_ *pbVar2;
  ulong uVar3;
  int iVar4;
  long lVar5;
  char *pcVar6;
  double dVar7;
  
  if ((long)this->buffer_size_ == 1) {
    pcVar6 = "Internal (tried to resize Silent_Blip_Buffer)";
  }
  else {
    lVar5 = 0xffad;
    if ((msec != 0) && (lVar1 = (msec + 1) * new_rate, lVar1 < 0x3e6b7e1)) {
      lVar5 = (lVar1 + 999) / 1000;
    }
    if (lVar5 != this->buffer_size_) {
      pbVar2 = (buf_t_ *)realloc(this->buffer_,lVar5 * 4 + 0x48);
      if (pbVar2 == (buf_t_ *)0x0) {
        return "Out of memory";
      }
      this->buffer_ = pbVar2;
    }
    this->buffer_size_ = (int)lVar5;
    this->sample_rate_ = new_rate;
    this->length_ = (int)((lVar5 * 1000) / new_rate) + -1;
    if (this->clock_rate_ != 0) {
      dVar7 = floor(((double)new_rate * 65536.0) / (double)this->clock_rate_ + 0.5);
      this->factor_ = (int)dVar7;
    }
    if (this->bass_freq_ < 1) {
      iVar4 = 0x1f;
    }
    else {
      uVar3 = (long)(this->bass_freq_ << 0x10) / new_rate;
      iVar4 = 0xd;
      do {
        if (uVar3 < 2) goto LAB_005811a8;
        uVar3 = (long)uVar3 >> 1;
        iVar4 = iVar4 + -1;
      } while (iVar4 != 0);
      iVar4 = 0;
    }
LAB_005811a8:
    this->bass_shift_ = iVar4;
    pcVar6 = (blargg_err_t)0x0;
    this->offset_ = 0;
    this->reader_accum_ = 0;
    this->modified_ = 0;
    if (this->buffer_ != (buf_t_ *)0x0) {
      pcVar6 = (blargg_err_t)0x0;
      memset(this->buffer_,0,(long)(int)lVar5 * 4 + 0x48);
    }
  }
  return pcVar6;
}

Assistant:

Blip_Buffer::blargg_err_t Blip_Buffer::set_sample_rate( long new_rate, int msec )
{
	if ( buffer_size_ == silent_buf_size )
	{
		assert( 0 );
		return "Internal (tried to resize Silent_Blip_Buffer)";
	}
	
	// start with maximum length that resampled time can represent
	long new_size = (UINT_MAX >> BLIP_BUFFER_ACCURACY) - blip_buffer_extra_ - 64;
	if ( msec != blip_max_length )
	{
		long s = (new_rate * (msec + 1) + 999) / 1000;
		if ( s < new_size )
			new_size = s;
		else
			assert( 0 ); // fails if requested buffer length exceeds limit
	}
	
	if ( buffer_size_ != new_size )
	{
		void* p = realloc( buffer_, (new_size + blip_buffer_extra_) * sizeof *buffer_ );
		if ( !p )
			return "Out of memory";
		buffer_ = (buf_t_*) p;
	}
	
	buffer_size_ = new_size;
	assert( buffer_size_ != silent_buf_size );
	
	// update things based on the sample rate
	sample_rate_ = new_rate;
	length_ = new_size * 1000 / new_rate - 1;
	if ( msec )
		assert( length_ == msec ); // ensure length is same as that passed in
	if ( clock_rate_ )
		clock_rate( clock_rate_ );
	bass_freq( bass_freq_ );
	
	clear();
	
	return 0; // success
}